

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

char * Cba_ManGetSliceName(Cba_Ntk_t *p,int iFon,int RangeId)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pName_00;
  Abc_Nam_t *pAVar4;
  Vec_Str_t *pVVar5;
  char *pName;
  int Right;
  int Left;
  int RangeId_local;
  int iFon_local;
  Cba_Ntk_t *p_local;
  
  uVar1 = Cba_NtkRangeLeft(p,RangeId);
  uVar2 = Cba_NtkRangeRight(p,RangeId);
  pName_00 = Cba_FonNameStr(p,iFon);
  iVar3 = Cba_FonName(p,iFon);
  iVar3 = Cba_NameIsLegalInVerilog(pName_00,iVar3);
  if (iVar3 == 0) {
    if (uVar1 == uVar2) {
      pAVar4 = Cba_NtkNam(p);
      pVVar5 = Abc_NamBuffer(pAVar4);
      p_local = (Cba_Ntk_t *)Vec_StrPrintF(pVVar5,"\\%s [%d]",pName_00,(ulong)uVar2);
    }
    else {
      pAVar4 = Cba_NtkNam(p);
      pVVar5 = Abc_NamBuffer(pAVar4);
      p_local = (Cba_Ntk_t *)Vec_StrPrintF(pVVar5,"\\%s [%d:%d]",pName_00,(ulong)uVar1,(ulong)uVar2)
      ;
    }
  }
  else if (uVar1 == uVar2) {
    pAVar4 = Cba_NtkNam(p);
    pVVar5 = Abc_NamBuffer(pAVar4);
    p_local = (Cba_Ntk_t *)Vec_StrPrintF(pVVar5,"%s[%d]",pName_00,(ulong)uVar2);
  }
  else {
    pAVar4 = Cba_NtkNam(p);
    pVVar5 = Abc_NamBuffer(pAVar4);
    p_local = (Cba_Ntk_t *)Vec_StrPrintF(pVVar5,"%s[%d:%d]",pName_00,(ulong)uVar1,(ulong)uVar2);
  }
  return (char *)p_local;
}

Assistant:

char * Cba_ManGetSliceName( Cba_Ntk_t * p, int iFon, int RangeId )
{
    int Left  = Cba_NtkRangeLeft(p, RangeId);
    int Right = Cba_NtkRangeRight(p, RangeId);
    char * pName = Cba_FonNameStr(p, iFon);
    if ( Cba_NameIsLegalInVerilog(pName, Cba_FonName(p, iFon)) )
        if ( Left == Right )
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "%s[%d]", pName, Right );
        else
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "%s[%d:%d]", pName, Left, Right );
    else
        if ( Left == Right )
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s [%d]", pName, Right );
        else
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s [%d:%d]", pName, Left, Right );
}